

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O0

bool __thiscall
uWS::HttpResponse<true>::internalEnd
          (HttpResponse<true> *this,string_view data,int totalSize,bool optional,
          bool allowContentLength)

{
  string_view status;
  size_type sVar1;
  HttpResponseData<true> *pHVar2;
  const_pointer pvVar3;
  AsyncSocket<true> *this_00;
  uint *puVar4;
  type_conflict *ptVar5;
  ulong uVar6;
  int in_ECX;
  HttpResponse<true> *in_RDX;
  AsyncSocket<true> *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  bool success;
  type_conflict *failed;
  type *written;
  HttpResponseData<true> *httpResponseData;
  HttpResponseData<true> *in_stack_ffffffffffffff28;
  HttpResponseData<true> *httpResponseData_00;
  AsyncSocket<true> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  byte bVar7;
  undefined8 in_stack_ffffffffffffff48;
  uint value;
  int iVar8;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  int local_24;
  undefined1 local_1;
  
  value = (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  bVar7 = (byte)in_R8D;
  iVar8 = in_ECX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  status._M_str._0_7_ = in_stack_ffffffffffffff68;
  status._M_len = (size_t)in_RDI;
  status._M_str._7_1_ = in_stack_ffffffffffffff6f;
  writeStatus(in_RDX,status);
  local_24 = in_ECX;
  if (in_ECX == 0) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8)
    ;
    local_24 = (int)sVar1;
  }
  pHVar2 = getHttpResponseData((HttpResponse<true> *)0x228c42);
  if ((pHVar2->state & 2U) == 0) {
    if ((pHVar2->state & 4U) == 0) {
      writeMark((HttpResponse<true> *)CONCAT44(iVar8,in_R8D));
      if ((in_R9B & 1) == 0) {
        AsyncSocket<true>::write(in_RDI,0x27e1b1,(void *)0x2,0);
      }
      else {
        AsyncSocket<true>::write(in_RDI,0x27e1b4,(void *)0x10,0);
        writeUnsigned((HttpResponse<true> *)CONCAT44(iVar8,in_R8D),value);
        AsyncSocket<true>::write(in_RDI,0x27e1af,(void *)0x4,0);
      }
      pHVar2->state = pHVar2->state | 4;
    }
    httpResponseData_00 = (HttpResponseData<true> *)&stack0xffffffffffffffe8;
    this_00 = (AsyncSocket<true> *)
              std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)httpResponseData_00);
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)httpResponseData_00);
    AsyncSocket<true>::write(in_RDI,(int)this_00,(void *)(sVar1 & 0xffffffff),(ulong)(bVar7 & 1));
    puVar4 = (uint *)std::get<0ul,int,bool>((pair<int,_bool> *)0x228e7a);
    ptVar5 = std::get<1ul,int,bool>((pair<int,_bool> *)0x228e89);
    pHVar2->offset = *puVar4 + pHVar2->offset;
    uVar6 = (ulong)*puVar4;
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8)
    ;
    bVar7 = 0;
    if (uVar6 == sVar1) {
      bVar7 = *ptVar5 ^ 0xff;
    }
    bVar7 = bVar7 & 1;
    if ((bVar7 == 0) || (pHVar2->offset == local_24)) {
      AsyncSocket<true>::timeout(this_00,(uint)((ulong)httpResponseData_00 >> 0x20));
    }
    if (pHVar2->offset == local_24) {
      markDone((HttpResponse<true> *)this_00,httpResponseData_00);
    }
    local_1 = bVar7 & 1;
  }
  else {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8)
    ;
    if (sVar1 != 0) {
      AsyncSocket<true>::write(in_RDI,0x27e1b1,(void *)0x2,0);
      std::basic_string_view<char,_std::char_traits<char>_>::length
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
      writeUnsignedHex((HttpResponse<true> *)CONCAT44(iVar8,in_R8D),value);
      AsyncSocket<true>::write(in_RDI,0x27e1b1,(void *)0x2,0);
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &stack0xffffffffffffffe8);
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffe8);
      AsyncSocket<true>::write(in_RDI,(int)pvVar3,(void *)(sVar1 & 0xffffffff),0);
    }
    AsyncSocket<true>::write(in_RDI,0x27e1ac,(void *)0x7,0);
    markDone((HttpResponse<true> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    AsyncSocket<true>::timeout
              (in_stack_ffffffffffffff30,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    local_1 = true;
  }
  return (bool)local_1;
}

Assistant:

bool internalEnd(std::string_view data, int totalSize, bool optional, bool allowContentLength = true) {
        /* Write status if not already done */
        writeStatus(HTTP_200_OK);

        /* If no total size given then assume this chunk is everything */
        if (!totalSize) {
            totalSize = (int) data.length();
        }

        HttpResponseData<SSL> *httpResponseData = getHttpResponseData();
        if (httpResponseData->state & HttpResponseData<SSL>::HTTP_WRITE_CALLED) {

            /* We do not have tryWrite-like functionalities, so ignore optional in this path */

            /* Do not allow sending 0 chunk here */
            if (data.length()) {
                Super::write("\r\n", 2);
                writeUnsignedHex((unsigned int) data.length());
                Super::write("\r\n", 2);

                /* Ignoring optional for now */
                Super::write(data.data(), (int) data.length());
            }

            /* Terminating 0 chunk */
            Super::write("\r\n0\r\n\r\n", 7);

            markDone(httpResponseData);

            /* tryEnd can never fail when in chunked mode, since we do not have tryWrite (yet), only write */
            Super::timeout(HTTP_TIMEOUT_S);
            return true;
        } else {
            /* Write content-length on first call */
            if (!(httpResponseData->state & HttpResponseData<SSL>::HTTP_END_CALLED)) {
                /* Write mark, this propagates to WebSockets too */
                writeMark();

                /* WebSocket upgrades does not allow content-length */
                if (allowContentLength) {
                    /* Even zero is a valid content-length */
                    Super::write("Content-Length: ", 16);
                    writeUnsigned(totalSize);
                    Super::write("\r\n\r\n", 4);
                } else {
                    Super::write("\r\n", 2);
                }

                /* Mark end called */
                httpResponseData->state |= HttpResponseData<SSL>::HTTP_END_CALLED;
            }

            /* Even if we supply no new data to write, its failed boolean is useful to know
             * if it failed to drain any prior failed header writes */

            /* Write as much as possible without causing backpressure */
            auto [written, failed] = Super::write(data.data(), (int) data.length(), optional);
            httpResponseData->offset += written;

            /* Success is when we wrote the entire thing without any failures */
            bool success = (unsigned int) written == data.length() && !failed;

            /* If we are now at the end, start a timeout. Also start a timeout if we failed. */
            if (!success || httpResponseData->offset == totalSize) {
                Super::timeout(HTTP_TIMEOUT_S);
            }

            /* Remove onAborted function if we reach the end */
            if (httpResponseData->offset == totalSize) {
                markDone(httpResponseData);
            }

            return success;
        }
    }